

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS ref_subdiv_split_qua(REF_SUBDIV ref_subdiv)

{
  uint uVar1;
  REF_STATUS RVar2;
  REF_STATUS ref_private_macro_code_rss_26;
  REF_STATUS ref_private_macro_code_rss_25;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i;
  REF_INT edge30;
  REF_INT edge23;
  REF_INT edge12;
  REF_INT edge01;
  REF_INT *marked_for_removal;
  REF_INT local_118;
  REF_INT new_cell;
  REF_INT new_nodes [27];
  REF_INT local_a4;
  REF_INT nodes [27];
  REF_CELL local_30;
  REF_CELL ref_cell_split;
  REF_CELL ref_cell;
  REF_SUBDIV pRStack_18;
  REF_INT cell;
  REF_SUBDIV ref_subdiv_local;
  
  ref_cell_split = ref_subdiv->grid->cell[6];
  pRStack_18 = ref_subdiv;
  if (ref_cell_split->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x414,
           "ref_subdiv_split_qua","malloc marked_for_removal of REF_INT negative");
    ref_subdiv_local._4_4_ = 1;
  }
  else {
    _edge12 = malloc((long)ref_cell_split->max << 2);
    if (_edge12 == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x414,"ref_subdiv_split_qua","malloc marked_for_removal of REF_INT NULL");
      ref_subdiv_local._4_4_ = 2;
    }
    else {
      for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < ref_cell_split->max;
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
        *(undefined4 *)((long)_edge12 + (long)ref_private_macro_code_rss_1 * 4) = 0;
      }
      uVar1 = ref_cell_create(&local_30,ref_cell_split->type);
      if (uVar1 == 0) {
        for (ref_cell._4_4_ = 0; ref_cell._4_4_ < ref_cell_split->max;
            ref_cell._4_4_ = ref_cell._4_4_ + 1) {
          if (((-1 < ref_cell._4_4_) && (ref_cell._4_4_ < ref_cell_split->max)) &&
             (ref_cell_split->c2n[ref_cell_split->size_per * ref_cell._4_4_] != -1)) {
            uVar1 = ref_cell_nodes(ref_cell_split,ref_cell._4_4_,new_nodes + 0x1a);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x419,"ref_subdiv_split_qua",(ulong)uVar1,"nodes");
              return uVar1;
            }
            uVar1 = ref_edge_with(pRStack_18->edge,new_nodes[0x1a],local_a4,&edge23);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x41b,"ref_subdiv_split_qua",(ulong)uVar1,"e01");
              return uVar1;
            }
            uVar1 = ref_edge_with(pRStack_18->edge,local_a4,nodes[0],&edge30);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x41d,"ref_subdiv_split_qua",(ulong)uVar1,"e12");
              return uVar1;
            }
            uVar1 = ref_edge_with(pRStack_18->edge,nodes[0],nodes[1],&ref_malloc_init_i);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x41f,"ref_subdiv_split_qua",(ulong)uVar1,"e23");
              return uVar1;
            }
            uVar1 = ref_edge_with(pRStack_18->edge,nodes[1],new_nodes[0x1a],
                                  &ref_private_macro_code_rss);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x421,"ref_subdiv_split_qua",(ulong)uVar1,"e30");
              return uVar1;
            }
            if (((pRStack_18->mark[edge23] != 0) && (pRStack_18->mark[ref_malloc_init_i] != 0)) &&
               ((pRStack_18->mark[edge30] != 0 &&
                (pRStack_18->mark[ref_private_macro_code_rss] != 0)))) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x426,"ref_subdiv_split_qua",6,"all quad edges");
              return 6;
            }
            if ((pRStack_18->mark[edge23] != pRStack_18->mark[ref_malloc_init_i]) ||
               (pRStack_18->mark[edge30] != pRStack_18->mark[ref_private_macro_code_rss])) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x42b,"ref_subdiv_split_qua",6,"quad edges not paired");
              return 6;
            }
            if ((pRStack_18->mark[edge23] != 0) && (pRStack_18->mark[ref_malloc_init_i] != 0)) {
              *(undefined4 *)((long)_edge12 + (long)ref_cell._4_4_ * 4) = 1;
              uVar1 = ref_cell_nodes(ref_cell_split,ref_cell._4_4_,&local_118);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x431,"ref_subdiv_split_qua",(ulong)uVar1,"nodes");
                return uVar1;
              }
              uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],local_a4,&new_cell);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x434,"ref_subdiv_split_qua",(ulong)uVar1,"mis");
                return uVar1;
              }
              uVar1 = ref_subdiv_node_between(pRStack_18,nodes[0],nodes[1],new_nodes);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x437,"ref_subdiv_split_qua",(ulong)uVar1,"mis");
                return uVar1;
              }
              uVar1 = ref_cell_add(local_30,&local_118,(REF_INT *)((long)&marked_for_removal + 4));
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x438,"ref_subdiv_split_qua",(ulong)uVar1,"add");
                return uVar1;
              }
              uVar1 = ref_cell_nodes(ref_cell_split,ref_cell._4_4_,&local_118);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x43a,"ref_subdiv_split_qua",(ulong)uVar1,"nodes");
                return uVar1;
              }
              uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],local_a4,&local_118);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x43d,"ref_subdiv_split_qua",(ulong)uVar1,"mis");
                return uVar1;
              }
              uVar1 = ref_subdiv_node_between(pRStack_18,nodes[0],nodes[1],new_nodes + 1);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x440,"ref_subdiv_split_qua",(ulong)uVar1,"mis");
                return uVar1;
              }
              uVar1 = ref_cell_add(local_30,&local_118,(REF_INT *)((long)&marked_for_removal + 4));
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x441,"ref_subdiv_split_qua",(ulong)uVar1,"add");
                return uVar1;
              }
            }
            if ((pRStack_18->mark[edge30] != 0) &&
               (pRStack_18->mark[ref_private_macro_code_rss] != 0)) {
              *(undefined4 *)((long)_edge12 + (long)ref_cell._4_4_ * 4) = 1;
              uVar1 = ref_cell_nodes(ref_cell_split,ref_cell._4_4_,&local_118);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x448,"ref_subdiv_split_qua",(ulong)uVar1,"nodes");
                return uVar1;
              }
              uVar1 = ref_subdiv_node_between(pRStack_18,local_a4,nodes[0],new_nodes);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,1099,"ref_subdiv_split_qua",(ulong)uVar1,"mis");
                return uVar1;
              }
              uVar1 = ref_subdiv_node_between(pRStack_18,nodes[1],new_nodes[0x1a],new_nodes + 1);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x44e,"ref_subdiv_split_qua",(ulong)uVar1,"mis");
                return uVar1;
              }
              uVar1 = ref_cell_add(local_30,&local_118,(REF_INT *)((long)&marked_for_removal + 4));
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x44f,"ref_subdiv_split_qua",(ulong)uVar1,"add");
                return uVar1;
              }
              uVar1 = ref_cell_nodes(ref_cell_split,ref_cell._4_4_,&local_118);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x451,"ref_subdiv_split_qua",(ulong)uVar1,"nodes");
                return uVar1;
              }
              uVar1 = ref_subdiv_node_between(pRStack_18,local_a4,nodes[0],&new_cell);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x454,"ref_subdiv_split_qua",(ulong)uVar1,"mis");
                return uVar1;
              }
              uVar1 = ref_subdiv_node_between(pRStack_18,nodes[1],new_nodes[0x1a],&local_118);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x457,"ref_subdiv_split_qua",(ulong)uVar1,"mis");
                return uVar1;
              }
              uVar1 = ref_cell_add(local_30,&local_118,(REF_INT *)((long)&marked_for_removal + 4));
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x458,"ref_subdiv_split_qua",(ulong)uVar1,"add");
                return uVar1;
              }
            }
          }
        }
        for (ref_cell._4_4_ = 0; ref_cell._4_4_ < ref_cell_split->max;
            ref_cell._4_4_ = ref_cell._4_4_ + 1) {
          if ((*(int *)((long)_edge12 + (long)ref_cell._4_4_ * 4) == 1) &&
             (uVar1 = ref_cell_remove(ref_cell_split,ref_cell._4_4_), uVar1 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x45e,"ref_subdiv_split_qua",(ulong)uVar1,"remove");
            return uVar1;
          }
        }
        for (ref_cell._4_4_ = 0; ref_cell._4_4_ < local_30->max; ref_cell._4_4_ = ref_cell._4_4_ + 1
            ) {
          RVar2 = ref_cell_nodes(local_30,ref_cell._4_4_,new_nodes + 0x1a);
          if ((RVar2 == 0) &&
             (uVar1 = ref_subdiv_add_local_cell(pRStack_18,ref_cell_split,new_nodes + 0x1a),
             uVar1 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x461,"ref_subdiv_split_qua",(ulong)uVar1,"add local");
            return uVar1;
          }
        }
        uVar1 = ref_cell_free(local_30);
        if (uVar1 == 0) {
          free(_edge12);
          ref_subdiv_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x463,"ref_subdiv_split_qua",(ulong)uVar1,"temp ref_cell free");
          ref_subdiv_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x416,"ref_subdiv_split_qua",(ulong)uVar1,"temp cell");
        ref_subdiv_local._4_4_ = uVar1;
      }
    }
  }
  return ref_subdiv_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_split_qua(REF_SUBDIV ref_subdiv) {
  REF_INT cell;
  REF_CELL ref_cell;
  REF_CELL ref_cell_split;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_cell;
  REF_INT *marked_for_removal;

  REF_INT edge01, edge12, edge23, edge30;

  ref_cell = ref_grid_qua(ref_subdiv_grid(ref_subdiv));

  ref_malloc_init(marked_for_removal, ref_cell_max(ref_cell), REF_INT, 0);

  RSS(ref_cell_create(&ref_cell_split, ref_cell_type(ref_cell)), "temp cell");

  each_ref_cell_valid_cell(ref_cell, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    RSS(ref_edge_with(ref_subdiv_edge(ref_subdiv), nodes[0], nodes[1], &edge01),
        "e01");
    RSS(ref_edge_with(ref_subdiv_edge(ref_subdiv), nodes[1], nodes[2], &edge12),
        "e12");
    RSS(ref_edge_with(ref_subdiv_edge(ref_subdiv), nodes[2], nodes[3], &edge23),
        "e23");
    RSS(ref_edge_with(ref_subdiv_edge(ref_subdiv), nodes[3], nodes[0], &edge30),
        "e30");
    if (ref_subdiv_mark(ref_subdiv, edge01) &&
        ref_subdiv_mark(ref_subdiv, edge23) &&
        ref_subdiv_mark(ref_subdiv, edge12) &&
        ref_subdiv_mark(ref_subdiv, edge30))
      RSS(REF_IMPLEMENT, "all quad edges");
    if (ref_subdiv_mark(ref_subdiv, edge01) !=
            ref_subdiv_mark(ref_subdiv, edge23) ||
        ref_subdiv_mark(ref_subdiv, edge12) !=
            ref_subdiv_mark(ref_subdiv, edge30))
      RSS(REF_IMPLEMENT, "quad edges not paired");

    if (ref_subdiv_mark(ref_subdiv, edge01) &&
        ref_subdiv_mark(ref_subdiv, edge23)) {
      marked_for_removal[cell] = 1;

      RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[3],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

      RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[3],
                                  &(new_nodes[3])),
          "mis");
      RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");
    }

    if (ref_subdiv_mark(ref_subdiv, edge12) &&
        ref_subdiv_mark(ref_subdiv, edge30)) {
      marked_for_removal[cell] = 1;

      RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[0],
                                  &(new_nodes[3])),
          "mis");
      RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

      RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[0],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");
    }
  }

  for (cell = 0; cell < ref_cell_max(ref_cell); cell++)
    if (1 == marked_for_removal[cell])
      RSS(ref_cell_remove(ref_cell, cell), "remove");

  each_ref_cell_valid_cell_with_nodes(ref_cell_split, cell, nodes)
      RSS(ref_subdiv_add_local_cell(ref_subdiv, ref_cell, nodes), "add local");

  RSS(ref_cell_free(ref_cell_split), "temp ref_cell free");
  free(marked_for_removal);

  return REF_SUCCESS;
}